

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electron.cpp
# Opt level: O2

void __thiscall Electron::ConcreteMachine<true>::set_key_state(ConcreteMachine<true> *this)

{
  bool in_DL;
  uint16_t in_SI;
  
  set_key_state((ConcreteMachine<true> *)
                &this[-1].speaker_.
                 super_LowpassBase<Outputs::Speaker::PullLowpass<Electron::SoundGenerator>,_false>.
                 super_Speaker.completed_sample_sets_,in_SI,in_DL);
  return;
}

Assistant:

void set_key_state(uint16_t key, bool isPressed) final {
			switch(key) {
				default:
					if(isPressed)
						key_states_[key >> 4] |= key&0xf;
					else
						key_states_[key >> 4] &= ~(key&0xf);
				break;

				case KeyBreak:
					m6502_.set_reset_line(isPressed);
				break;

#define FuncShiftedKey(source, dest)	\
				case source:	\
					set_key_state(KeyFunc, isPressed);	\
					set_key_state(dest, isPressed);	\
				break;

				FuncShiftedKey(KeyF1, Key1);
				FuncShiftedKey(KeyF2, Key2);
				FuncShiftedKey(KeyF3, Key3);
				FuncShiftedKey(KeyF4, Key4);
				FuncShiftedKey(KeyF5, Key5);
				FuncShiftedKey(KeyF6, Key6);
				FuncShiftedKey(KeyF7, Key7);
				FuncShiftedKey(KeyF8, Key8);
				FuncShiftedKey(KeyF9, Key9);
				FuncShiftedKey(KeyF0, Key0);

#undef FuncShiftedKey
			}
		}